

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O2

bool anon_unknown.dwarf_17d33b::GlContextImpl::parseVersionString
               (char *version,char *prefix,uint *major,uint *minor)

{
  int iVar1;
  size_t __n;
  size_t sVar2;
  
  __n = strlen(prefix);
  sVar2 = strlen(version);
  if ((((__n + 3 <= sVar2) && (iVar1 = strncmp(version,prefix,__n), iVar1 == 0)) &&
      ((int)version[__n] - 0x30U < 10)) &&
     ((version[__n + 1] == '.' && ((int)version[__n + 2] - 0x30U < 10)))) {
    *major = (int)version[__n] - 0x30U;
    *minor = (int)version[__n + 2] - 0x30;
    return true;
  }
  return false;
}

Assistant:

bool parseVersionString(const char* version, const char* prefix, unsigned int &major, unsigned int &minor)
        {
            std::size_t prefixLength = std::strlen(prefix);

            if ((std::strlen(version) >= (prefixLength + 3)) &&
                (std::strncmp(version, prefix, prefixLength) == 0) &&
                std::isdigit(version[prefixLength]) &&
                (version[prefixLength + 1] == '.') &&
                std::isdigit(version[prefixLength + 2]))
            {
                major = static_cast<unsigned int>(version[prefixLength] - '0');
                minor = static_cast<unsigned int>(version[prefixLength + 2] - '0');

                return true;
            }

            return false;
        }